

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::newEmbedDataNode
          (BaseBuilder *this,EmbedDataNode **out,TypeId typeId,void *data,size_t itemCount,
          size_t repeatCount)

{
  undefined1 uVar1;
  char cVar2;
  uint uVar3;
  Error EVar4;
  unsigned_long __n;
  void *__dest;
  void *in_RCX;
  byte in_DL;
  long *in_RSI;
  BaseBuilder *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  uint8_t *dstData;
  Error _err;
  EmbedDataNode *node;
  size_t dataSize;
  FastUInt8 of;
  uint32_t typeSize;
  TypeId finalTypeId;
  uint32_t deabstractDelta;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 uVar5;
  byte bVar6;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 uVar7;
  uint in_stack_ffffffffffffff20;
  long local_d8;
  Error local_80;
  undefined4 local_50;
  undefined4 local_4c;
  uint local_48;
  undefined1 local_43;
  undefined1 local_42;
  undefined4 local_40;
  undefined4 local_3c;
  uint local_38;
  undefined1 local_33;
  undefined1 local_32;
  byte local_31;
  undefined4 *local_30;
  undefined4 *local_28;
  uint *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  uint *local_8;
  
  *in_RSI = 0;
  uVar3 = 8;
  if (((in_RDI->super_BaseEmitter)._environment._arch & k32BitMask) == k32BitMask) {
    uVar3 = 4;
  }
  cVar2 = '\x06';
  if (7 < uVar3) {
    cVar2 = '\b';
  }
  local_42 = 0x20;
  local_43 = 0x21;
  local_48 = (uint)in_DL;
  local_4c = 0x20;
  local_50 = 0x21;
  local_8 = &local_48;
  local_10 = &local_4c;
  local_18 = &local_50;
  uVar7 = 0x1f < local_48 && local_48 < 0x22;
  bVar6 = in_DL;
  if ((bool)uVar7) {
    bVar6 = in_DL + cVar2;
  }
  local_32 = 0x20;
  local_33 = 100;
  local_38 = (uint)bVar6;
  local_3c = 0x20;
  local_40 = 100;
  local_20 = &local_38;
  local_28 = &local_3c;
  local_30 = &local_40;
  uVar5 = 0x1f < local_38 && local_38 < 0x65;
  local_31 = bVar6;
  if (0x1f < local_38 && local_38 < 0x65) {
    uVar1 = TypeUtils::_typeData[(ulong)bVar6 + 0x100];
    __n = Support::mulOverflow<unsigned_long>
                    ((unsigned_long *)CONCAT17(uVar7,in_stack_ffffffffffffff10),
                     (unsigned_long *)in_RDI,
                     (FastUInt8 *)CONCAT17(bVar6,CONCAT16(uVar5,in_stack_ffffffffffffff00)));
    local_80 = _newNodeT<asmjit::v1_14::EmbedDataNode>
                         (in_RDI,(EmbedDataNode **)
                                 CONCAT17(bVar6,CONCAT16(uVar5,in_stack_ffffffffffffff00)));
    EVar4 = (Error)((ulong)in_RDI >> 0x20);
    if (local_80 == 0) {
      *(byte *)(local_d8 + 0x12) = in_DL;
      *(undefined1 *)(local_d8 + 0x13) = uVar1;
      *(undefined8 *)(local_d8 + 0x30) = in_R8;
      *(undefined8 *)(local_d8 + 0x38) = in_R9;
      __dest = (void *)(local_d8 + 0x40);
      if (0x40 < __n) {
        __dest = Zone::alloc((Zone *)(ulong)in_stack_ffffffffffffff20,(size_t)__dest,
                             CONCAT17(uVar7,in_stack_ffffffffffffff10));
        if (__dest == (void *)0x0) {
          DebugUtils::errored(1);
          EVar4 = BaseEmitter::reportError
                            ((BaseEmitter *)CONCAT17(uVar7,in_stack_ffffffffffffff10),EVar4,
                             (char *)CONCAT17(bVar6,CONCAT16(uVar5,in_stack_ffffffffffffff00)));
          return EVar4;
        }
        *(void **)(local_d8 + 0x40) = __dest;
      }
      if (in_RCX != (void *)0x0) {
        memcpy(__dest,in_RCX,__n);
      }
      *in_RSI = local_d8;
      local_80 = 0;
    }
  }
  else {
    DebugUtils::errored(2);
    local_80 = BaseEmitter::reportError
                         ((BaseEmitter *)CONCAT17(uVar7,in_stack_ffffffffffffff10),
                          (Error)((ulong)in_RDI >> 0x20),
                          (char *)CONCAT17(bVar6,CONCAT16(uVar5,in_stack_ffffffffffffff00)));
  }
  return local_80;
}

Assistant:

Error BaseBuilder::newEmbedDataNode(EmbedDataNode** out, TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  *out = nullptr;

  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedDataNode>(&node));

  node->_embed._typeId = typeId;
  node->_embed._typeSize = uint8_t(typeSize);
  node->_itemCount = itemCount;
  node->_repeatCount = repeatCount;

  uint8_t* dstData = node->_inlineData;
  if (dataSize > EmbedDataNode::kInlineBufferSize) {
    dstData = static_cast<uint8_t*>(_dataZone.alloc(dataSize, 8));
    if (ASMJIT_UNLIKELY(!dstData))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    node->_externalData = dstData;
  }

  if (data)
    memcpy(dstData, data, dataSize);

  *out = node;
  return kErrorOk;
}